

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naviebayes.cpp
# Opt level: O0

void __thiscall NavieBayes::bayesEstim(NavieBayes *this,double *lmbda)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  bool bVar5;
  vector<double,_std::allocator<double>_> *this_00;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  mapped_type_conflict *pmVar9;
  reference pvVar10;
  reference ppVar11;
  reference ppVar12;
  size_type sVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *iter;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *__range1_1;
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>
  *d;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  unsigned_long i_1;
  string local_f8;
  string local_d8;
  undefined1 local_b8 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  cond;
  unsigned_long j;
  unsigned_long i;
  string local_58;
  reference local_38;
  double *gt;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  double *lmbda_local;
  NavieBayes *this_local;
  
  this_00 = &(this->super_Base).trainDataGT;
  __end1 = std::vector<double,_std::allocator<double>_>::begin(this_00);
  gt = (double *)std::vector<double,_std::allocator<double>_>::end(this_00);
  while( true ) {
    bVar5 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&gt);
    if (!bVar5) break;
    local_38 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&__end1);
    std::__cxx11::to_string(&local_58,*local_38);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[](&this->priProb,&local_58);
    *pmVar9 = *pmVar9 + 1.0;
    std::__cxx11::string::~string((string *)&local_58);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  for (j = 0; j < (this->super_Base).indim; j = j + 1) {
    cond.second.field_2._8_8_ = 0;
    while( true ) {
      uVar4 = cond.second.field_2._8_8_;
      sVar6 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(&(this->super_Base).trainDataF);
      if (sVar6 <= (ulong)uVar4) break;
      pvVar7 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&(this->super_Base).trainDataF,cond.second.field_2._8_8_);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,j);
      std::__cxx11::to_string(&local_d8,*pvVar8);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(this->super_Base).trainDataGT,cond.second.field_2._8_8_);
      std::__cxx11::to_string(&local_f8,*pvVar8);
      std::make_pair<std::__cxx11::string,std::__cxx11::string>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_b8,&local_d8,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_d8);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(this->super_Base).trainDataGT,cond.second.field_2._8_8_);
      std::__cxx11::to_string((string *)&i_1,*pvVar8);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[](&this->priProb,(key_type *)&i_1);
      dVar1 = *pmVar9;
      dVar2 = *lmbda;
      pvVar7 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->xVal,j);
      sVar6 = std::vector<double,_std::allocator<double>_>::size(pvVar7);
      auVar16._8_4_ = (int)(sVar6 >> 0x20);
      auVar16._0_8_ = sVar6;
      auVar16._12_4_ = 0x45300000;
      pvVar10 = std::
                vector<std::map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>_>,_std::allocator<std::map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>_>_>_>
                ::operator[](&this->condProb,j);
      pmVar9 = std::
               map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>_>
               ::operator[](pvVar10,(key_type *)local_b8);
      *pmVar9 = 1.0 / (dVar2 * ((auVar16._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)) +
                      dVar1) + *pmVar9;
      std::__cxx11::string::~string((string *)&i_1);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_b8);
      cond.second.field_2._8_8_ = cond.second.field_2._8_8_ + 1;
    }
  }
  for (__range2 = (value_type *)0x0; __range2 < (value_type *)(this->super_Base).indim;
      __range2 = (value_type *)&(__range2->_M_t)._M_impl.field_0x1) {
    pvVar10 = std::
              vector<std::map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>_>,_std::allocator<std::map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>_>_>_>
              ::operator[](&this->condProb,(size_type)__range2);
    __end2 = std::
             map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>_>
             ::begin(pvVar10);
    d = (pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>
         *)std::
           map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>_>
           ::end(pvVar10);
    while( true ) {
      bVar5 = std::operator!=(&__end2,(_Self *)&d);
      if (!bVar5) break;
      ppVar11 = std::
                _Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>
                ::operator*(&__end2);
      dVar1 = *lmbda;
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[](&this->priProb,&(ppVar11->first).second);
      dVar2 = *pmVar9;
      dVar3 = *lmbda;
      pvVar7 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->xVal,(size_type)__range2);
      sVar6 = std::vector<double,_std::allocator<double>_>::size(pvVar7);
      auVar17._8_4_ = (int)(sVar6 >> 0x20);
      auVar17._0_8_ = sVar6;
      auVar17._12_4_ = 0x45300000;
      ppVar11->second =
           dVar1 / (dVar3 * ((auVar17._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)) + dVar2)
           + ppVar11->second;
      std::
      _Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>
      ::operator++(&__end2);
    }
  }
  __end1_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::begin(&this->priProb);
  iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
            ::end(&this->priProb);
  while( true ) {
    bVar5 = std::operator!=(&__end1_1,(_Self *)&iter);
    if (!bVar5) break;
    ppVar12 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
              ::operator*(&__end1_1);
    dVar1 = ppVar12->second;
    dVar2 = *lmbda;
    sVar6 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&(this->super_Base).trainDataF);
    sVar13 = std::vector<double,_std::allocator<double>_>::size(&this->yVal);
    lVar14 = sVar6 + sVar13;
    auVar15._8_4_ = (int)((ulong)lVar14 >> 0x20);
    auVar15._0_8_ = lVar14;
    auVar15._12_4_ = 0x45300000;
    ppVar12->second =
         (dVar1 + dVar2) /
         ((auVar15._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0));
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

void NavieBayes::bayesEstim(const double& lmbda = 1.0){
    for(const auto& gt: trainDataGT){
        priProb[std::to_string(gt)] += 1.0;
    }
    for(unsigned long i=0;i<indim;++i){
        for(unsigned long j=0;j<trainDataF.size();++j)
        {
            auto cond = std::make_pair(std::to_string(trainDataF[j][i]), std::to_string(trainDataGT[j]));

            condProb[i][cond] += 1.0/(priProb[std::to_string(trainDataGT[j])]+lmbda*xVal[i].size());
        }
    }
    for(unsigned long i=0;i<indim;++i){
        for(auto& d:condProb[i]){
            d.second += lmbda/(priProb[d.first.second]+lmbda*xVal[i].size());
        }
    }

    for(auto& iter:priProb)
        iter.second = (iter.second+lmbda)/(double(trainDataF.size()+yVal.size()));
}